

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

uintptr_t websocket_subscribe(websocket_subscribe_s args)

{
  fio_ls_s *pfVar1;
  int iVar2;
  intptr_t *piVar3;
  subscription_s *psVar4;
  fio_ls_s *pfVar5;
  int *piVar6;
  long lVar7;
  code *pcVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  char *format;
  code *pcVar11;
  intptr_t type;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  subscribe_args_s in_stack_ffffffffffffff38;
  fio_lock_i ret;
  undefined4 local_70 [2];
  size_t local_68;
  size_t sStack_60;
  char *local_58;
  fio_match_fn local_50;
  code *local_48;
  code *local_40;
  intptr_t local_38;
  intptr_t *local_30;
  
  bVar14 = 0;
  if ((args.ws == (ws_s *)0x0) || (iVar2 = fio_is_valid((args.ws)->fd), iVar2 == 0)) {
    if (args.on_unsubscribe != (_func_void_void_ptr *)0x0) {
      (*args.on_unsubscribe)(args.udata);
    }
    return 0;
  }
  piVar3 = (intptr_t *)malloc(0x18);
  if (piVar3 == (intptr_t *)0x0) {
    if (FIO_LOG_LEVEL < 1) goto LAB_0014ebe7;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/websockets.c:635"
    ;
  }
  else {
    *piVar3 = (intptr_t)args.on_message;
    piVar3[1] = (intptr_t)args.on_unsubscribe;
    piVar3[2] = (intptr_t)args.udata;
    if (args.on_message == (_func_void_ws_s_ptr_fio_str_info_s_fio_str_info_s_void_ptr *)0x0) {
      bVar12 = ((undefined1  [72])args & (undefined1  [72])0x2) == (undefined1  [72])0x0;
      pcVar8 = websocket_on_pubsub_message_direct_txt;
      if (bVar12) {
        pcVar8 = websocket_on_pubsub_message_direct;
      }
      bVar13 = ((undefined1  [72])args & (undefined1  [72])0x1) == (undefined1  [72])0x0;
      type = -0x22;
      if (bVar13) {
        type = (ulong)bVar12 - 0x21;
      }
      pcVar11 = websocket_on_pubsub_message_direct_bin;
      if (bVar13) {
        pcVar11 = pcVar8;
      }
      websocket_optimize4broadcasts(type,1);
      *piVar3 = type;
    }
    else {
      pcVar11 = websocket_on_pubsub_message;
    }
    local_70[0] = 0;
    local_68 = args.channel.capa;
    sStack_60 = args.channel.len;
    local_58 = args.channel.data;
    local_50 = args.match;
    local_48 = pcVar11;
    local_40 = websocket_on_unsubscribe;
    local_38 = (args.ws)->fd;
    local_30 = piVar3;
    puVar9 = (undefined8 *)local_70;
    puVar10 = (undefined8 *)&stack0xffffffffffffff38;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
    }
    psVar4 = fio_subscribe(in_stack_ffffffffffffff38);
    if (psVar4 == (subscription_s *)0x0) {
      return 0;
    }
    fio_lock(&(args.ws)->sub_lock);
    pfVar5 = (fio_ls_s *)calloc(0x18,1);
    if (pfVar5 != (fio_ls_s *)0x0) {
      pfVar1 = ((args.ws)->subscriptions).prev;
      pfVar5->prev = pfVar1;
      pfVar5->next = &(args.ws)->subscriptions;
      pfVar5->obj = psVar4;
      pfVar1->next = pfVar5;
      ((args.ws)->subscriptions).prev = pfVar5;
      LOCK();
      (args.ws)->sub_lock = '\0';
      UNLOCK();
      return (uintptr_t)pfVar5;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0014ebe7;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
    ;
  }
  FIO_LOG2STDERR(format);
LAB_0014ebe7:
  kill(0,2);
  piVar6 = __errno_location();
  exit(*piVar6);
}

Assistant:

uintptr_t websocket_subscribe(struct websocket_subscribe_s args) {
  if (!args.ws || !fio_is_valid(args.ws->fd))
    goto error;
  websocket_sub_data_s *d = malloc(sizeof(*d));
  FIO_ASSERT_ALLOC(d);
  *d = (websocket_sub_data_s){
      .udata = args.udata,
      .on_message = args.on_message,
      .on_unsubscribe = args.on_unsubscribe,
  };
  void (*handler)(fio_msg_s *) = websocket_on_pubsub_message;
  if (!args.on_message) {
    intptr_t br_type;
    if (args.force_binary) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_BINARY;
      handler = websocket_on_pubsub_message_direct_bin;
    } else if (args.force_text) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_TEXT;
      handler = websocket_on_pubsub_message_direct_txt;
    } else {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB;
      handler = websocket_on_pubsub_message_direct;
    }
    websocket_optimize4broadcasts(br_type, 1);
    d->on_message =
        (void (*)(ws_s *, fio_str_info_s, fio_str_info_s, void *))br_type;
  }
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .match = args.match,
                    .on_unsubscribe = websocket_on_unsubscribe,
                    .on_message = handler, .udata1 = (void *)args.ws->fd,
                    .udata2 = d);
  if (!sub) {
    /* don't free `d`, return (`d` freed by fio_subscribe) */
    return 0;
  }
  fio_ls_s *pos;
  fio_lock(&args.ws->sub_lock);
  pos = fio_ls_push(&args.ws->subscriptions, sub);
  fio_unlock(&args.ws->sub_lock);

  return (uintptr_t)pos;
error:
  if (args.on_unsubscribe)
    args.on_unsubscribe(args.udata);
  return 0;
}